

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  ostream *in_stack_00000010;
  istream *in_stack_00000018;
  CommandLineInterface *in_stack_00000020;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  shared;
  unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>_>
  kvs;
  unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>_>
  backendKvs;
  BuildParameters supermapParams;
  CommandLineInterface cli;
  shared_ptr<supermap::cli::AddKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  *in_stack_fffffffffffffd48;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  *in_stack_fffffffffffffd50;
  CommandLineInterface *this;
  string *in_stack_fffffffffffffd58;
  string *command;
  CommandLineInterface *in_stack_fffffffffffffd60;
  CommandLineInterface *this_00;
  RemovableBuilder<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>
  *in_stack_fffffffffffffd78;
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  *__args;
  allocator<char> *in_stack_fffffffffffffd80;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd88;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  shared_ptr<supermap::cli::GetValueHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  local_248;
  allocator<char> local_231;
  string local_230 [71];
  allocator<char> local_1e9;
  string *in_stack_fffffffffffffe18;
  CommandLineInterface *in_stack_fffffffffffffe20;
  allocator<char> local_1a1;
  string local_1a0 [48];
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  local_170;
  allocator<char> local_159;
  string local_158 [40];
  BuildParameters *in_stack_fffffffffffffed0;
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
  *in_stack_fffffffffffffed8;
  char local_f8 [23];
  allocator<char> local_e1;
  undefined8 local_e0;
  undefined8 local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined8 local_b0;
  allocator<char> local_91;
  string local_90 [144];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  supermap::cli::CommandLineInterface::CommandLineInterface
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  local_e0 = 3;
  local_d8 = 0x3fe0000000000000;
  this_01 = &local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  local_b0 = 0x3fa0000000000000;
  std::allocator<char>::~allocator(&local_e1);
  std::make_unique<supermap::BST<supermap::Key<1ul>,unsigned_long,unsigned_long>>();
  __s = local_f8;
  std::
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1ul>,unsigned_long,unsigned_long>,std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1ul>,unsigned_long,unsigned_long>>>
  ::
  unique_ptr<supermap::BST<supermap::Key<1ul>,unsigned_long,unsigned_long>,std::default_delete<supermap::BST<supermap::Key<1ul>,unsigned_long,unsigned_long>>,void>
            ((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
              *)in_stack_fffffffffffffd60,
             (unique_ptr<supermap::BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
              *)in_stack_fffffffffffffd58);
  supermap::
  DefaultSupermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ::build(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffd50);
  std::
  unique_ptr<supermap::BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<supermap::BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::BST<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffd50);
  supermap::builder::
  fromKvs<supermap::Key<1ul>,supermap::MaybeRemovedValue<supermap::ByteArray<1ul>>,unsigned_long>
            ((unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>_>
              *)in_stack_fffffffffffffd48);
  supermap::detail::
  KeyValueStorageBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ::removable((KeyValueStorageBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
               *)in_stack_fffffffffffffd48);
  supermap::detail::RemovableBuilder<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
  build(in_stack_fffffffffffffd78);
  supermap::detail::
  PrimitiveKvsBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ::~PrimitiveKvsBuilder
            ((PrimitiveKvsBuilder<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
              *)0x10aa19);
  std::
  unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>_>
  ::release((unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>_>
             *)0x10aa26);
  std::
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>::
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,void>
            (in_stack_fffffffffffffd50,
             (KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *)
             in_stack_fffffffffffffd48);
  __a = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::
  make_shared<supermap::cli::AddKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            ((shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
              *)in_stack_fffffffffffffd78);
  __args = &local_170;
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::
  shared_ptr<supermap::cli::AddKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,void>
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)in_stack_fffffffffffffd50,
             in_stack_fffffffffffffd48);
  supermap::cli::CommandLineInterface::addCommand
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (shared_ptr<supermap::cli::CommandLineInterface::Handler> *)in_stack_fffffffffffffd50);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)0x10aabf);
  std::
  shared_ptr<supermap::cli::AddKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  ::~shared_ptr((shared_ptr<supermap::cli::AddKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                 *)0x10aacc);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::
  make_shared<supermap::cli::RemoveKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (__args);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::
  shared_ptr<supermap::cli::RemoveKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,void>
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)in_stack_fffffffffffffd50,
             (shared_ptr<supermap::cli::RemoveKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
              *)in_stack_fffffffffffffd48);
  supermap::cli::CommandLineInterface::addCommand
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (shared_ptr<supermap::cli::CommandLineInterface::Handler> *)in_stack_fffffffffffffd50);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)0x10ab6d);
  std::
  shared_ptr<supermap::cli::RemoveKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  ::~shared_ptr((shared_ptr<supermap::cli::RemoveKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                 *)0x10ab7a);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  this_00 = (CommandLineInterface *)&local_1e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::
  make_shared<supermap::cli::ContainsKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (__args);
  command = (string *)(local_230 + 0x30);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::
  shared_ptr<supermap::cli::ContainsKeyHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,void>
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)in_stack_fffffffffffffd50,
             (shared_ptr<supermap::cli::ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
              *)in_stack_fffffffffffffd48);
  supermap::cli::CommandLineInterface::addCommand
            (this_00,command,
             (shared_ptr<supermap::cli::CommandLineInterface::Handler> *)in_stack_fffffffffffffd50);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)0x10ac1b);
  std::
  shared_ptr<supermap::cli::ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  ::~shared_ptr((shared_ptr<supermap::cli::ContainsKeyHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                 *)0x10ac28);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  std::allocator<char>::~allocator(&local_1e9);
  this = (CommandLineInterface *)&local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
  std::
  make_shared<supermap::cli::GetValueHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,std::shared_ptr<supermap::KeyValueStorage<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>>&>
            (__args);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::
  shared_ptr<supermap::cli::GetValueHandler<supermap::Key<1ul>,supermap::ByteArray<1ul>,unsigned_long>,void>
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)this,&local_248);
  supermap::cli::CommandLineInterface::addCommand
            (this_00,command,(shared_ptr<supermap::cli::CommandLineInterface::Handler> *)this);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)0x10acbb);
  std::
  shared_ptr<supermap::cli::GetValueHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  ::~shared_ptr((shared_ptr<supermap::cli::GetValueHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                 *)0x10acc5);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  supermap::cli::CommandLineInterface::run(in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::
  shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
  ::~shared_ptr((shared_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>
                 *)0x10ad09);
  std::
  unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>_>_>
                 *)this_00);
  std::
  unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>_>_>
                 *)this);
  supermap::
  DefaultSupermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
  ::BuildParameters::~BuildParameters((BuildParameters *)0x10ad30);
  supermap::cli::CommandLineInterface::~CommandLineInterface(this);
  return 0;
}

Assistant:

int main(int, const char **) {
    supermap::cli::CommandLineInterface cli("supermap");

    using K = supermap::Key<1>;
    using V = supermap::ByteArray<1>;
    using I = std::uint64_t;
    using MaybeV = supermap::MaybeRemovedValue<V>;

    using SupermapBuilder = supermap::DefaultSupermap<K, MaybeV, I>;

    auto supermapParams = SupermapBuilder::BuildParameters{
        3,
        0.5,
        "supermap",
        1 / 32.0
    };

    auto backendKvs = SupermapBuilder::build(
        std::make_unique<supermap::BST<K, I, I>>(),
        supermapParams
    );

    std::unique_ptr<supermap::KeyValueStorage<K, V, I>> kvs =
        supermap::builder::fromKvs<K, MaybeV, I>(std::move(backendKvs))
            .removable()
            .build();

    std::shared_ptr<supermap::KeyValueStorage<K, V, I>>
        shared = std::shared_ptr<supermap::KeyValueStorage<K, V, I>>(kvs.release());

    cli.addCommand("add", std::make_shared<supermap::cli::AddKeyHandler<K, V, I>>(shared));
    cli.addCommand("remove", std::make_shared<supermap::cli::RemoveKeyHandler<K, V, I>>(shared));
    cli.addCommand("contains", std::make_shared<supermap::cli::ContainsKeyHandler<K, V, I>>(shared));
    cli.addCommand("get", std::make_shared<supermap::cli::GetValueHandler<K, V, I>>(shared));

    cli.run(std::cin, std::cout);
}